

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O3

uint64_t helper_pminub_mips(uint64_t fs,uint64_t ft)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  
  bVar1 = (byte)fs;
  bVar6 = (byte)ft;
  bVar2 = (byte)(fs >> 8);
  bVar7 = (byte)(ft >> 8);
  bVar3 = (byte)(fs >> 0x10);
  bVar8 = (byte)(ft >> 0x10);
  bVar5 = (byte)(ft >> 0x18);
  bVar4 = (byte)(fs >> 0x18);
  return (ulong)CONCAT13((bVar4 < bVar5) * bVar4 | (bVar4 >= bVar5) * bVar5,
                         CONCAT12((bVar3 < bVar8) * bVar3 | (bVar3 >= bVar8) * bVar8,
                                  CONCAT11((bVar2 < bVar7) * bVar2 | (bVar2 >= bVar7) * bVar7,
                                           (bVar1 < bVar6) * bVar1 | (bVar1 >= bVar6) * bVar6))) |
         fs & 0xffffffff00000000;
}

Assistant:

uint64_t helper_pminub(uint64_t fs, uint64_t ft)
{
    LMIValue vs, vt;
    unsigned i;

    vs.d = fs;
    vt.d = ft;
    for (i = 0; i < 4; i++) {
        vs.ub[i] = (vs.ub[i] <= vt.ub[i] ? vs.ub[i] : vt.ub[i]);
    }
    return vs.d;
}